

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void __thiscall google::CapturedStream::StopCapture(CapturedStream *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  LogMessage local_78;
  LogMessageVoidify local_11;
  CapturedStream *local_10;
  CapturedStream *this_local;
  
  local_10 = this;
  bVar1 = glog_internal_namespace_::FileDescriptor::operator_cast_to_bool(&this->uncaptured_fd_);
  if (bVar1) {
    fflush((FILE *)0x0);
    iVar2 = glog_internal_namespace_::FileDescriptor::get(&this->uncaptured_fd_);
    iVar2 = dup2(iVar2,this->fd_);
    if (iVar2 == -1) {
      LogMessageVoidify::LogMessageVoidify(&local_11);
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
                 ,0x14a);
      poVar3 = LogMessage::stream(&local_78);
      poVar3 = std::operator<<(poVar3,"Check failed: dup2(uncaptured_fd_.get(), fd_) != -1 ");
      LogMessageVoidify::operator&(&local_11,poVar3);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
    }
  }
  return;
}

Assistant:

void StopCapture() {
    // Restore original stream
    if (uncaptured_fd_) {
      fflush(nullptr);
      CHECK(dup2(uncaptured_fd_.get(), fd_) != -1);
    }
  }